

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int ffbinse(char *binspec,int *imagetype,int *histaxis,char (*colname) [71],double *minin,
           double *maxin,double *binsizein,char (*minname) [71],char (*maxname) [71],
           char (*binname) [71],double *wt,char *wtname,int *recip,char ***exprs,int *status)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  char *pcVar5;
  int *in_RCX;
  char **in_RDX;
  char *in_RSI;
  long in_RDI;
  double *in_R8;
  double *in_R9;
  undefined8 *in_stack_00000008;
  char *in_stack_00000010;
  char *in_stack_00000018;
  char *in_stack_00000020;
  char *ptr_1;
  size_t nchars;
  undefined4 *in_stack_00000038;
  int has_exprs;
  char *exprend [5];
  char *exprbeg [5];
  double dummy;
  char *file_expr;
  char tmpname [71];
  char *ptr;
  int defaulttype;
  int slen;
  int ii;
  char *in_stack_fffffffffffffec8;
  double *in_stack_fffffffffffffed0;
  char **in_stack_fffffffffffffed8;
  long lVar6;
  undefined4 in_stack_fffffffffffffee0;
  int iVar7;
  char *in_stack_fffffffffffffee8;
  char **in_stack_fffffffffffffef0;
  char *in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  int *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  int *in_stack_ffffffffffffff20;
  char *local_a8 [9];
  char *local_60;
  uint local_54;
  int local_50;
  int local_4c;
  double *local_48;
  double *local_40;
  int local_14;
  
  local_48 = in_R9;
  local_40 = in_R8;
  memset(&stack0xffffffffffffff18,0,0x28);
  memset(&stack0xfffffffffffffee8,0,0x28);
  iVar7 = 0;
  if (exprend[0] != (char *)0x0) {
    exprend[0][0] = '\0';
    exprend[0][1] = '\0';
    exprend[0][2] = '\0';
    exprend[0][3] = '\0';
    exprend[0][4] = '\0';
    exprend[0][5] = '\0';
    exprend[0][6] = '\0';
    exprend[0][7] = '\0';
  }
  if (*(int *)exprend[1] < 1) {
    *(undefined4 *)in_RDX = 2;
    in_RSI[0] = '\x1f';
    in_RSI[1] = '\0';
    in_RSI[2] = '\0';
    in_RSI[3] = '\0';
    local_54 = 1;
    ptr_1[0] = '\0';
    ptr_1[1] = '\0';
    ptr_1[2] = '\0';
    ptr_1[3] = '\0';
    ptr_1[4] = '\0';
    ptr_1[5] = '\0';
    ptr_1[6] = -0x10;
    ptr_1[7] = '?';
    *in_stack_00000038 = 0;
    *(undefined1 *)nchars = 0;
    for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
      *(undefined1 *)((long)in_RCX + (long)local_4c * 0x47) = 0;
      in_stack_00000010[(long)local_4c * 0x47] = '\0';
      in_stack_00000018[(long)local_4c * 0x47] = '\0';
      in_stack_00000020[(long)local_4c * 0x47] = '\0';
      local_40[local_4c] = -9.1191291391491e-36;
      local_48[local_4c] = -9.1191291391491e-36;
      in_stack_00000008[local_4c] = 0xb8a83e285ebab4b7;
    }
    local_60 = (char *)(in_RDI + 3);
    if (*local_60 == 'i') {
      in_RSI[0] = '\x15';
      in_RSI[1] = '\0';
      in_RSI[2] = '\0';
      in_RSI[3] = '\0';
      local_54 = 0;
      local_60 = (char *)(in_RDI + 4);
    }
    else if (*local_60 == 'j') {
      local_54 = 0;
      local_60 = (char *)(in_RDI + 4);
    }
    else if (*local_60 == 'r') {
      in_RSI[0] = '*';
      in_RSI[1] = '\0';
      in_RSI[2] = '\0';
      in_RSI[3] = '\0';
      local_54 = 0;
      local_60 = (char *)(in_RDI + 4);
    }
    else if (*local_60 == 'd') {
      in_RSI[0] = 'R';
      in_RSI[1] = '\0';
      in_RSI[2] = '\0';
      in_RSI[3] = '\0';
      local_54 = 0;
      local_60 = (char *)(in_RDI + 4);
    }
    else {
      cVar1 = *local_60;
      if (cVar1 == 'b') {
        in_RSI[0] = '\v';
        in_RSI[1] = '\0';
        in_RSI[2] = '\0';
        in_RSI[3] = '\0';
        local_54 = 0;
        local_60 = (char *)(in_RDI + 4);
      }
      local_54 = (uint)(cVar1 != 'b');
    }
    if (*local_60 == '\0') {
      local_14 = *(int *)exprend[1];
    }
    else if (*local_60 == ' ') {
      for (; *local_60 == ' '; local_60 = local_60 + 1) {
      }
      if (*local_60 == '\0') {
        local_14 = *(int *)exprend[1];
      }
      else {
        if (*local_60 == '@') {
          iVar2 = ffimport_file(in_RSI,in_RDX,in_RCX);
          if (iVar2 != 0) {
            return *(int *)exprend[1];
          }
          for (local_60 = (char *)0x0; *local_60 == ' '; local_60 = local_60 + 1) {
          }
        }
        if (*local_60 == '(') {
          for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
            do {
              local_60 = local_60 + 1;
            } while (*local_60 == ' ');
            sVar3 = strcspn(local_60," ,)");
            local_50 = (int)sVar3;
            strncat((char *)((long)in_RCX + (long)local_4c * 0x47),local_60,(long)local_50);
            for (local_60 = local_60 + local_50; *local_60 == ' '; local_60 = local_60 + 1) {
            }
            if (*local_60 == ')') {
              *(int *)in_RDX = local_4c + 1;
              break;
            }
          }
          if (local_4c == 4) {
            ffpmsg((char *)0x1ea05d);
            ffpmsg((char *)0x1ea06a);
            exprend[1][0] = '}';
            exprend[1][1] = '\0';
            exprend[1][2] = '\0';
            exprend[1][3] = '\0';
            return 0x7d;
          }
          do {
            pcVar5 = local_60;
            local_60 = pcVar5 + 1;
          } while (*local_60 == ' ');
          if (*local_60 == '\0') {
            return *(int *)exprend[1];
          }
          if (*local_60 != '=') {
            ffpmsg((char *)0x1ea134);
            ffpmsg((char *)0x1ea140);
            ffpmsg((char *)0x1ea14d);
            exprend[1][0] = '}';
            exprend[1][1] = '\0';
            exprend[1][2] = '\0';
            exprend[1][3] = '\0';
            return 0x7d;
          }
          for (local_60 = pcVar5 + 2; *local_60 == ' '; local_60 = local_60 + 1) {
          }
          ffbinr(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (double *)CONCAT44(iVar7,in_stack_fffffffffffffee0),
                 (double *)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                 in_stack_fffffffffffffec8,(char *)in_stack_ffffffffffffff10,
                 in_stack_ffffffffffffff18,in_stack_ffffffffffffff20);
          if (0 < *(int *)exprend[1]) {
            ffpmsg((char *)0x1ea233);
            ffpmsg((char *)0x1ea240);
            return *(int *)exprend[1];
          }
          for (local_4c = 1; local_4c < *(int *)in_RDX; local_4c = local_4c + 1) {
            local_40[local_4c] = *local_40;
            local_48[local_4c] = *local_48;
            in_stack_00000008[local_4c] = *in_stack_00000008;
            strcpy(in_stack_00000010 + (long)local_4c * 0x47,in_stack_00000010);
            strcpy(in_stack_00000018 + (long)local_4c * 0x47,in_stack_00000018);
            strcpy(in_stack_00000020 + (long)local_4c * 0x47,in_stack_00000020);
          }
          for (; *local_60 == ' '; local_60 = local_60 + 1) {
          }
          if (*local_60 != ';') {
            if (*local_60 != '\0') {
              ffpmsg((char *)0x1ea3ce);
              ffpmsg((char *)0x1ea3db);
              exprend[1][0] = '}';
              exprend[1][1] = '\0';
              exprend[1][2] = '\0';
              exprend[1][3] = '\0';
              return 0x7d;
            }
            return *(int *)exprend[1];
          }
        }
        else {
          for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
            *(undefined8 *)(&stack0xfffffffffffffee8 + (long)local_4c * 8) = 0;
            *(undefined8 *)(&stack0xffffffffffffff18 + (long)local_4c * 8) = 0;
            ffbinre(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,(char **)exprend[1],
                    (char **)(in_stack_00000020 + (long)local_4c * 0x47),
                    (double *)(in_stack_00000018 + (long)local_4c * 0x47),
                    (double *)(in_stack_00000010 + (long)local_4c * 0x47),
                    (double *)in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
                    in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,in_stack_ffffffffffffff10);
            if (*(long *)(&stack0xffffffffffffff18 + (long)local_4c * 8) != 0) {
              iVar7 = 1;
            }
            if (0 < *(int *)exprend[1]) {
              ffpmsg((char *)0x1ea589);
              ffpmsg((char *)0x1ea596);
              return *(int *)exprend[1];
            }
            if ((*local_60 == '\0') || (*local_60 == ';')) break;
            if (*local_60 == ' ') {
              for (; *local_60 == ' '; local_60 = local_60 + 1) {
              }
              if ((*local_60 == '\0') || (*local_60 == ';')) break;
              if (*local_60 == ',') {
                local_60 = local_60 + 1;
              }
            }
            else {
              if (*local_60 != ',') {
                ffpmsg((char *)0x1ea69e);
                ffpmsg((char *)0x1ea6ab);
                exprend[1][0] = '}';
                exprend[1][1] = '\0';
                exprend[1][2] = '\0';
                exprend[1][3] = '\0';
                return 0x7d;
              }
              local_60 = local_60 + 1;
            }
          }
          if (local_4c == 4) {
            ffpmsg((char *)0x1ea711);
            ffpmsg((char *)0x1ea71d);
            ffpmsg((char *)0x1ea72a);
            exprend[1][0] = '}';
            exprend[1][1] = '\0';
            exprend[1][2] = '\0';
            exprend[1][3] = '\0';
            return 0x7d;
          }
          *(int *)in_RDX = local_4c + 1;
          if (((((*(int *)in_RDX == 1) && ((char)*in_RCX == '\0')) &&
               (*local_40 == -9.1191291391491e-36)) &&
              ((!NAN(*local_40) && (*local_48 == -9.1191291391491e-36)))) && (!NAN(*local_48))) {
            *(int *)in_RDX = 2;
            in_stack_00000008[1] = *in_stack_00000008;
          }
        }
        if (*local_60 == ';') {
          do {
            pcVar5 = local_60;
            local_60 = pcVar5 + 1;
          } while (*local_60 == ' ');
          *in_stack_00000038 = 0;
          if (*local_60 == '/') {
            *in_stack_00000038 = 1;
            for (local_60 = pcVar5 + 2; *local_60 == ' '; local_60 = local_60 + 1) {
            }
          }
          ffbinre(in_stack_fffffffffffffed8,(char *)in_stack_fffffffffffffed0,(char **)exprend[1],
                  local_a8,(double *)local_a8,(double *)local_a8,(double *)in_stack_fffffffffffffef0
                  ,in_stack_fffffffffffffef8,in_stack_ffffffffffffff00,(char *)0x0,
                  in_stack_ffffffffffffff10);
          if (0 < *(int *)exprend[1]) {
            ffpmsg((char *)0x1ea943);
            ffpmsg((char *)0x1ea950);
            return *(int *)exprend[1];
          }
          if (((local_54 != 0) && ((*(double *)ptr_1 != 1.0 || (NAN(*(double *)ptr_1))))) ||
             ((local_54 != 0 && (*(char *)nchars != '\0')))) {
            in_RSI[0] = '*';
            in_RSI[1] = '\0';
            in_RSI[2] = '\0';
            in_RSI[3] = '\0';
          }
        }
        for (; *local_60 == ' '; local_60 = local_60 + 1) {
        }
        if (*local_60 != '\0') {
          ffpmsg((char *)0x1eaa27);
          ffpmsg((char *)0x1eaa34);
          exprend[1][0] = '}';
          exprend[1][1] = '\0';
          exprend[1][2] = '\0';
          exprend[1][3] = '\0';
        }
        if (iVar7 != 0) {
          lVar6 = 0;
          for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
            lVar6 = (*(long *)(&stack0xfffffffffffffee8 + (long)local_4c * 8) -
                    *(long *)(&stack0xffffffffffffff18 + (long)local_4c * 8)) + 1 + lVar6;
          }
          pvVar4 = malloc(lVar6 + 0x28);
          if (pvVar4 == (void *)0x0) {
            ffpmsg((char *)0x1eaaec);
            exprend[1][0] = 'q';
            exprend[1][1] = '\0';
            exprend[1][2] = '\0';
            exprend[1][3] = '\0';
            return 0x71;
          }
          *(void **)exprend[0] = pvVar4;
          pcVar5 = (char *)(*(long *)exprend[0] + 0x28);
          for (local_4c = 0; local_4c < 5; local_4c = local_4c + 1) {
            *(char **)(*(long *)exprend[0] + (long)local_4c * 8) = pcVar5;
            sVar3 = *(long *)(&stack0xfffffffffffffee8 + (long)local_4c * 8) -
                    *(long *)(&stack0xffffffffffffff18 + (long)local_4c * 8);
            strncpy(pcVar5,*(char **)(&stack0xffffffffffffff18 + (long)local_4c * 8),sVar3);
            pcVar5[sVar3] = '\0';
            pcVar5 = pcVar5 + sVar3 + 1;
          }
        }
        local_14 = *(int *)exprend[1];
      }
    }
    else {
      ffpmsg((char *)0x1e9e19);
      ffpmsg((char *)0x1e9e26);
      exprend[1][0] = '}';
      exprend[1][1] = '\0';
      exprend[1][2] = '\0';
      exprend[1][3] = '\0';
      local_14 = 0x7d;
    }
  }
  else {
    local_14 = *(int *)exprend[1];
  }
  return local_14;
}

Assistant:

int ffbinse(char *binspec,   /* I - binning specification */
                   int *imagetype,      /* O - image type, TINT or TSHORT */
                   int *histaxis,       /* O - no. of axes in the histogram */
                   char colname[4][FLEN_VALUE],  /* column name for axis */
                   double *minin,        /* minimum value for each axis */
                   double *maxin,        /* maximum value for each axis */
                   double *binsizein,    /* size of bins on each axis */
                   char minname[4][FLEN_VALUE],  /* keyword name for min */
                   char maxname[4][FLEN_VALUE],  /* keyword name for max */
                   char binname[4][FLEN_VALUE],  /* keyword name for binsize */
                   double *wt,          /* weighting factor          */
                   char *wtname,        /* keyword or column name for weight */
                   int *recip,          /* the reciprocal of the weight? */
	           char ***exprs,       /* returned with expressions (or 0) */
                   int *status)
{
/*
   Parse the extended input binning specification string, returning
   the binning parameters.  Supports up to 4 dimensions.  The binspec
   string has one of these forms:

   bin binsize                  - 2D histogram with binsize on each axis
   bin xcol                     - 1D histogram on column xcol
   bin (xcol, ycol) = binsize   - 2D histogram with binsize on each axis
   bin x=min:max:size, y=min:max:size, z..., t... 
   bin x=:max, y=::size
   bin x=size, y=min::size
   bin x(expr), y(expr)=min:max:size, ...

   most other reasonable combinations are supported. The (expr) is an 
   optional expression that will be calculated on the fly instead of
   a table column name.  The name is still used for the output pixel
   array metadata.

   If expr == 0, then expressions are forbidden.  The caller does not
   expect expressions.  

   If exprs is non-zero, then upon return an array of expressions is
   passed back to the caller.  Storage may be allocated by this routine,
   If *exprs is non-zero upon return, the caller is responsible to
   free(*exprs).  Upon return, the contains of exprs is,
       (*exprs)[0] = expression for column 1 (or 0 if none)
       (*exprs)[1] = expression for column 2 (or 0 if none)
       (*exprs)[2] = expression for column 3 (or 0 if none)
       (*exprs)[3] = expression for column 4 (or 0 if none)
       (*exprs)[4] = expression for weighting (or 0 if none)

   If the user specifies a column name and not an expression for bin
   axis i, then the corresponding (*exprs)[i] will be a null pointer.

   To be recognized as an expression, the weighting expression must be
   enclosed in parentheses.

   Expressions are never allowed using the bin (xcol,ycol) notation.

*/
    int ii, slen, defaulttype;
    char *ptr, tmpname[FLEN_VALUE], *file_expr = NULL;
    double  dummy;
    char *exprbeg[5] = {0}, *exprend[5] = {0};
    int has_exprs = 0;

    if (exprs) (*exprs) = 0; /* initialized output */

    if (*status > 0)
         return(*status);

    /* set the default values */
    *histaxis = 2;
    *imagetype = TINT;
    defaulttype = 1;
    *wt = 1.;
    *recip = 0;
    *wtname = '\0';

    /* set default values */
    for (ii = 0; ii < 4; ii++)
    {
        *colname[ii] = '\0';
        *minname[ii] = '\0';
        *maxname[ii] = '\0';
        *binname[ii] = '\0';
        minin[ii] = DOUBLENULLVALUE;  /* undefined values */
        maxin[ii] = DOUBLENULLVALUE;
        binsizein[ii] = DOUBLENULLVALUE;
    }

    ptr = binspec + 3;  /* skip over 'bin' */

    if (*ptr == 'i' )  /* bini */
    {
        *imagetype = TSHORT;
        defaulttype = 0;
        ptr++;
    }
    else if (*ptr == 'j' )  /* binj; same as default */
    {
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'r' )  /* binr */
    {
        *imagetype = TFLOAT;
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'd' )  /* bind */
    {
        *imagetype = TDOUBLE;
        defaulttype = 0;
        ptr ++;
    }
    else if (*ptr == 'b' )  /* binb */
    {
        *imagetype = TBYTE;
        defaulttype = 0;
        ptr ++;
    }

    if (*ptr == '\0')  /* use all defaults for other parameters */
        return(*status);
    else if (*ptr != ' ')  /* must be at least one blank */
    {
        ffpmsg("binning specification syntax error:");
        ffpmsg(binspec);
        return(*status = URL_PARSE_ERROR);
    }

    while (*ptr == ' ')  /* skip over blanks */
           ptr++;

    if (*ptr == '\0')   /* no other parameters; use defaults */
        return(*status);

    /* Check if need to import expression from a file */

    if( *ptr=='@' ) {
       if( ffimport_file( ptr+1, &file_expr, status ) ) return(*status);
       ptr = file_expr;
       while (*ptr == ' ')
               ptr++;       /* skip leading white space... again */
    }

    if (*ptr == '(' )
    {
        /* this must be the opening parenthesis around a list of column */
        /* names, optionally followed by a '=' and the binning spec. */

        for (ii = 0; ii < 4; ii++)
        {
            ptr++;               /* skip over the '(', ',', or ' ') */
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            slen = strcspn(ptr, " ,)");
            strncat(colname[ii], ptr, slen); /* copy 1st column name */

            ptr += slen;
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            if (*ptr == ')' )   /* end of the list of names */
            {
                *histaxis = ii + 1;
                break;
            }
        }

        if (ii == 4)   /* too many names in the list , or missing ')'  */
        {
            ffpmsg(
 "binning specification has too many column names or is missing closing ')':");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        ptr++;  /* skip over the closing parenthesis */
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        if (*ptr == '\0') {
	    if( file_expr ) free( file_expr );
            return(*status);  /* parsed the entire string */
	}

        else if (*ptr != '=')  /* must be an equals sign now*/
        {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg(" an equals sign '=' must follow the column names");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        ptr++;  /* skip over the equals sign */
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        /* get the single range specification for all the columns */
	/* Note that the extended syntax is not allowed here */
        ffbinr(&ptr, tmpname, minin,
	       maxin, binsizein, minname[0],
	       maxname[0], binname[0], status);
        if (*status > 0)
        {
            ffpmsg("illegal binning specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        for (ii = 1; ii < *histaxis; ii++)
        {
            minin[ii] = minin[0];
            maxin[ii] = maxin[0];
            binsizein[ii] = binsizein[0];
            strcpy(minname[ii], minname[0]);
            strcpy(maxname[ii], maxname[0]);
            strcpy(binname[ii], binname[0]);
        }

        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        if (*ptr == ';')
            goto getweight;   /* a weighting factor is specified */

        if (*ptr != '\0')  /* must have reached end of string */
        {
            ffpmsg("illegal syntax after binning range specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }

        return(*status);
    }             /* end of case with list of column names in ( )  */

    /* if we've reached this point, then the binning specification */
    /* must be of the form: XCOL = min:max:binsize, YCOL = ...     */
    /* where the column name followed by '=' are optional.         */
    /* If the column name is not specified, then use the default name */

    for (ii = 0; ii < 4; ii++) /* allow up to 4 histogram dimensions */
    {
        exprbeg[ii] = exprend[ii] = 0;
        ffbinre(&ptr, colname[ii], &(exprbeg[ii]), &(exprend[ii]),
		&minin[ii], &maxin[ii], &binsizein[ii], minname[ii],
		maxname[ii], binname[ii], status);
	/* Check for expressions */
	if (exprbeg[ii]) has_exprs = 1;
	
        if (*status > 0)
        {
            ffpmsg("illegal syntax in binning range specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        if (*ptr == '\0' || *ptr == ';')
            break;        /* reached the end of the string */

        if (*ptr == ' ')
        {
            while (*ptr == ' ')  /* skip over blanks */
                ptr++;

            if (*ptr == '\0' || *ptr == ';')
                break;        /* reached the end of the string */

            if (*ptr == ',')
                ptr++;  /* comma separates the next column specification */
        }
        else if (*ptr == ',')
        {          
            ptr++;  /* comma separates the next column specification */
        }
        else
        {
            ffpmsg("illegal characters following binning specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status = URL_PARSE_ERROR);
        }
    }

    if (ii == 4)
    {
        /* there are yet more characters in the string */
        ffpmsg("illegal binning specification in URL:");
        ffpmsg("apparently greater than 4 histogram dimensions");
        ffpmsg(binspec);
        return(*status = URL_PARSE_ERROR);
    }
    else
        *histaxis = ii + 1;

    /* special case: if a single number was entered it should be      */
    /* interpreted as the binning factor for the default X and Y axes */

    if (*histaxis == 1 && *colname[0] == '\0' && 
         minin[0] == DOUBLENULLVALUE && maxin[0] == DOUBLENULLVALUE)
    {
        *histaxis = 2;
        binsizein[1] = binsizein[0];
    }

getweight:
    if (*ptr == ';')  /* looks like a weighting factor is given */
    {
        ptr++;
       
        while (*ptr == ' ')  /* skip over blanks */
            ptr++;

        *recip = 0;
        if (*ptr == '/')
        {
            *recip = 1;  /* the reciprocal of the weight is entered */
            ptr++;

            while (*ptr == ' ')  /* skip over blanks */
                ptr++;
        }

        /* parse the weight as though it were a binrange. */
        /* either a column name or a numerical value will be returned */

        exprbeg[4] = exprend[4] = 0;
        ffbinre(&ptr, wtname, &(exprbeg[4]), &(exprend[4]),
		&dummy, &dummy, wt, tmpname,
		tmpname, tmpname, status);
	if (exprbeg[4]) has_exprs = 1;

        if (*status > 0)
        {
            ffpmsg("illegal binning weight specification in URL:");
            ffpmsg(binspec);
	    if( file_expr ) free( file_expr );
            return(*status);
        }

        /* creat a float datatype histogram by default, if weight */
        /* factor is not = 1.0  */

        if ( (defaulttype && *wt != 1.0) || 
	     (defaulttype && *wtname) ||
	     (defaulttype && exprbeg[4])) {
	  *imagetype = TFLOAT;
	}
    }

    while (*ptr == ' ')  /* skip over blanks */
         ptr++;

    if (*ptr != '\0')  /* should have reached the end of string */
    {
        ffpmsg("illegal syntax after binning weight specification in URL:");
        ffpmsg(binspec);
        *status = URL_PARSE_ERROR;
    }

    if( file_expr ) free( file_expr );

    /* If we found expressions, this is where we accumulate them into 
       something to be returned to the caller.  The start and end of
       each expression will be found in exprbeg[] and exprend[], with
       the 5th entry being the weight expression if any */
    if (has_exprs) {
      size_t nchars = 0;
      char *ptr;
      for (ii = 0; ii <= 4; ii++) {
	nchars += (exprend[ii] - exprbeg[ii]) + 1; /* null terminator */
      }
      /* Allocate storage for 5 pointers plus the characters.  Caller
         is responsible to free(*exprs) which will free both the 5-array
	 and the character string data. */
      ptr = malloc( sizeof(char *) * 5 + nchars * sizeof(char) );
      if (!ptr) {
	ffpmsg("ffbinse: memory allocation failure");
        return(*status = MEMORY_ALLOCATION);
      }
      
      (*exprs) = (char **) ptr;     /* Pointer array portion */
      ptr = (char *) (&((*exprs)[5])); /* String portion starts after the pointer array */
      for (ii = 0; ii <= 4; ii++) {
	(*exprs)[ii] = ptr;
	nchars = (exprend[ii]-exprbeg[ii]);
	strncpy(ptr, exprbeg[ii], nchars);
	ptr += nchars;
	ptr[0] = 0; /* Ensure null terminator */
	ptr ++; /* Advance to next string position */
      }
    }      
      
    return(*status);
}